

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void nn_hash_rehash(nn_hash *self)

{
  uint uVar1;
  nn_list *ptr;
  nn_list *pnVar2;
  int iVar3;
  nn_list *pnVar4;
  nn_list_item *item;
  nn_list_item *it;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = self->slots;
  ptr = self->array;
  self->slots = uVar1 * 2;
  pnVar4 = (nn_list *)nn_alloc_((ulong)(uVar1 * 2) << 4);
  self->array = pnVar4;
  if (pnVar4 != (nn_list *)0x0) {
    if (self->slots != 0) {
      uVar7 = 0;
      do {
        nn_list_init(self->array + uVar7);
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
      } while (uVar6 != self->slots);
    }
    if ((ulong)uVar1 != 0) {
      uVar7 = 0;
      do {
        pnVar4 = ptr + uVar7;
        while( true ) {
          iVar3 = nn_list_empty(pnVar4);
          if (iVar3 != 0) break;
          nn_list_begin(pnVar4);
          item = nn_list_begin(pnVar4);
          nn_list_erase(pnVar4,item);
          uVar6 = (*(uint *)&item[-1].prev >> 0x10 ^ *(uint *)&item[-1].prev ^ 0x3d) * 9;
          uVar5 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
          uVar6 = self->slots;
          pnVar2 = self->array;
          it = nn_list_end(pnVar2 + (ulong)(uVar5 >> 0xf ^ uVar5) % (ulong)uVar6);
          nn_list_insert(pnVar2 + (ulong)(uVar5 >> 0xf ^ uVar5) % (ulong)uVar6,item,it);
        }
        nn_list_term(pnVar4);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar1);
    }
    nn_free(ptr);
    return;
  }
  nn_hash_rehash_cold_1();
}

Assistant:

static void nn_hash_rehash (struct nn_hash *self) {
    uint32_t i;
    uint32_t oldslots;
    struct nn_list *oldarray;
    struct nn_hash_item *hitm;
    uint32_t newslot;

    /*  Allocate new double-sized array of slots. */
    oldslots = self->slots;
    oldarray = self->array;
    self->slots *= 2;
    self->array = nn_alloc (sizeof (struct nn_list) * self->slots, "hash map");
    alloc_assert (self->array);
    for (i = 0; i != self->slots; ++i)
    nn_list_init (&self->array [i]);

    /*  Move the items from old slot array to new slot array. */
    for (i = 0; i != oldslots; ++i) {
    while (!nn_list_empty (&oldarray [i])) {
        hitm = nn_cont (nn_list_begin (&oldarray [i]),
                struct nn_hash_item, list);
        nn_list_erase (&oldarray [i], &hitm->list);
        newslot = nn_hash_key (hitm->key) % self->slots;
        nn_list_insert (&self->array [newslot], &hitm->list,
                nn_list_end (&self->array [newslot]));
    }

    nn_list_term (&oldarray [i]);
    }

    /*  Deallocate the old array of slots. */
    nn_free (oldarray);
}